

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptRegExpConstructor::DeleteProperty
          (JavascriptRegExpConstructor *this,JavascriptString *propertyNameString,
          PropertyOperationFlags flags)

{
  PropertyOperationFlags flags_00;
  bool bVar1;
  BOOL BVar2;
  ScriptContext *pSVar3;
  char16 *varName;
  PropertyId local_34;
  PropertyRecord *pPStack_30;
  PropertyId propertyId;
  PropertyRecord *propertyRecord;
  JavascriptString *pJStack_20;
  PropertyOperationFlags flags_local;
  JavascriptString *propertyNameString_local;
  JavascriptRegExpConstructor *this_local;
  
  pPStack_30 = (PropertyRecord *)0x0;
  propertyRecord._4_4_ = flags;
  pJStack_20 = propertyNameString;
  propertyNameString_local = (JavascriptString *)this;
  pSVar3 = RecyclableObject::GetScriptContext(&propertyNameString->super_RecyclableObject);
  ScriptContext::GetOrAddPropertyRecord(pSVar3,pJStack_20,&stack0xffffffffffffffd0);
  local_34 = PropertyRecord::GetPropertyId(pPStack_30);
  bVar1 = BuiltInPropertyRecord<6>::Equals
                    ((BuiltInPropertyRecord<6> *)BuiltInPropertyRecords::input,&local_34);
  if (((((((!bVar1) &&
          (bVar1 = BuiltInPropertyRecord<3>::Equals
                             ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::__,&local_34),
          !bVar1)) &&
         (bVar1 = BuiltInPropertyRecord<10>::Equals
                            ((BuiltInPropertyRecord<10> *)BuiltInPropertyRecords::lastMatch,
                             &local_34), !bVar1)) &&
        ((bVar1 = BuiltInPropertyRecord<3>::Equals
                            ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::_Ampersand,
                             &local_34), !bVar1 &&
         (bVar1 = BuiltInPropertyRecord<10>::Equals
                            ((BuiltInPropertyRecord<10> *)BuiltInPropertyRecords::lastParen,
                             &local_34), !bVar1)))) &&
       (((bVar1 = BuiltInPropertyRecord<3>::Equals
                            ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::_Plus,&local_34),
         !bVar1 && ((bVar1 = BuiltInPropertyRecord<12>::Equals
                                       ((BuiltInPropertyRecord<12> *)
                                        BuiltInPropertyRecords::leftContext,&local_34), !bVar1 &&
                    (bVar1 = BuiltInPropertyRecord<3>::Equals
                                       ((BuiltInPropertyRecord<3> *)
                                        BuiltInPropertyRecords::_BackTick,&local_34), !bVar1)))) &&
        (bVar1 = BuiltInPropertyRecord<13>::Equals
                           ((BuiltInPropertyRecord<13> *)BuiltInPropertyRecords::rightContext,
                            &local_34), !bVar1)))) &&
      ((((bVar1 = BuiltInPropertyRecord<3>::Equals
                            ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::_Tick,&local_34),
         !bVar1 && (bVar1 = BuiltInPropertyRecord<3>::Equals
                                      ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::_1,
                                       &local_34), !bVar1)) &&
        (bVar1 = BuiltInPropertyRecord<3>::Equals
                           ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::_2,&local_34),
        !bVar1)) &&
       (((bVar1 = BuiltInPropertyRecord<3>::Equals
                            ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::_3,&local_34),
         !bVar1 && (bVar1 = BuiltInPropertyRecord<3>::Equals
                                      ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::_4,
                                       &local_34), !bVar1)) &&
        ((bVar1 = BuiltInPropertyRecord<3>::Equals
                            ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::_5,&local_34),
         !bVar1 && ((bVar1 = BuiltInPropertyRecord<3>::Equals
                                       ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::_6,
                                        &local_34), !bVar1 &&
                    (bVar1 = BuiltInPropertyRecord<3>::Equals
                                       ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::_7,
                                        &local_34), !bVar1)))))))))) &&
     ((bVar1 = BuiltInPropertyRecord<3>::Equals
                         ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::_8,&local_34), !bVar1
      && ((bVar1 = BuiltInPropertyRecord<3>::Equals
                             ((BuiltInPropertyRecord<3> *)BuiltInPropertyRecords::_9,&local_34),
          !bVar1 && (bVar1 = BuiltInPropertyRecord<6>::Equals
                                       ((BuiltInPropertyRecord<6> *)BuiltInPropertyRecords::index,
                                        &local_34), !bVar1)))))) {
    BVar2 = JavascriptFunction::DeleteProperty
                      ((JavascriptFunction *)this,pJStack_20,propertyRecord._4_4_);
    return BVar2;
  }
  flags_00 = propertyRecord._4_4_;
  pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  varName = JavascriptString::GetString(pJStack_20);
  JavascriptError::ThrowCantDeleteIfStrictMode(flags_00,pSVar3,varName);
  return 0;
}

Assistant:

BOOL JavascriptRegExpConstructor::DeleteProperty(JavascriptString *propertyNameString, PropertyOperationFlags flags)
    {
        PropertyRecord const * propertyRecord = nullptr;
        propertyNameString->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        PropertyId propertyId = propertyRecord->GetPropertyId();

        if (BuiltInPropertyRecords::input.Equals(propertyId)
            || BuiltInPropertyRecords::$_.Equals(propertyId)
            || BuiltInPropertyRecords::lastMatch.Equals(propertyId)
            || BuiltInPropertyRecords::$Ampersand.Equals(propertyId)
            || BuiltInPropertyRecords::lastParen.Equals(propertyId)
            || BuiltInPropertyRecords::$Plus.Equals(propertyId)
            || BuiltInPropertyRecords::leftContext.Equals(propertyId)
            || BuiltInPropertyRecords::$BackTick.Equals(propertyId)
            || BuiltInPropertyRecords::rightContext.Equals(propertyId)
            || BuiltInPropertyRecords::$Tick.Equals(propertyId)
            || BuiltInPropertyRecords::$1.Equals(propertyId)
            || BuiltInPropertyRecords::$2.Equals(propertyId)
            || BuiltInPropertyRecords::$3.Equals(propertyId)
            || BuiltInPropertyRecords::$4.Equals(propertyId)
            || BuiltInPropertyRecords::$5.Equals(propertyId)
            || BuiltInPropertyRecords::$6.Equals(propertyId)
            || BuiltInPropertyRecords::$7.Equals(propertyId)
            || BuiltInPropertyRecords::$8.Equals(propertyId)
            || BuiltInPropertyRecords::$9.Equals(propertyId)
            || BuiltInPropertyRecords::index.Equals(propertyId))
        {
            JavascriptError::ThrowCantDeleteIfStrictMode(flags, GetScriptContext(), propertyNameString->GetString());
            return false;
        }

        return JavascriptFunction::DeleteProperty(propertyNameString, flags);
    }